

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

CURLcode telnet_do(Curl_easy *data,_Bool *done)

{
  char *str;
  uchar *puVar1;
  byte bVar2;
  curl_socket_t cVar3;
  connectdata *pcVar4;
  ulong uVar5;
  TELNET *pTVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  ssize_t sVar10;
  _Bool _Var11;
  int iVar12;
  CURLcode CVar13;
  CURLcode CVar14;
  uint uVar15;
  TELNET *pTVar16;
  curl_slist *pcVar17;
  char *pcVar18;
  curl_slist *pcVar19;
  size_t sVar20;
  timediff_t tVar21;
  byte *pbVar22;
  TELNET *pTVar23;
  char *pcVar24;
  ulong uVar25;
  curl_slist **ppcVar26;
  long lVar27;
  uint nfds;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  curltime cVar31;
  curltime newer;
  curltime older;
  ssize_t nread;
  uchar **local_1090;
  pollfd pfd [2];
  timediff_t local_1060;
  long local_1050;
  long local_1048;
  char buffer [4096];
  
  pcVar4 = data->conn;
  cVar3 = pcVar4->sock[0];
  *done = true;
  pTVar16 = (TELNET *)(*Curl_ccalloc)(1,0x1e58);
  if (pTVar16 == (TELNET *)0x0) {
LAB_00156e68:
    CVar13 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_dyn_init(&pTVar16->out,0xffff);
    (data->req).p.telnet = pTVar16;
    pTVar16->telrcv_state = CURL_TS_DATA;
    pTVar16->subpointer = pTVar16->subbuffer;
    pTVar16->us_preferred[3] = 1;
    pTVar16->him_preferred[3] = 1;
    pTVar16->us_preferred[0] = 1;
    pTVar16->him_preferred[0] = 1;
    pTVar16->him_preferred[1] = 1;
    pTVar16->subnegotiation[0x1f] = 1;
    pTVar16 = (data->req).p.telnet;
    if ((data->state).aptr.user != (char *)0x0) {
      pcVar24 = data->conn->user;
      _Var11 = str_is_nonascii(pcVar24);
      if (_Var11) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      curl_msnprintf(buffer,0x100,"USER,%s",pcVar24);
      pcVar17 = curl_slist_append(pTVar16->telnet_vars,buffer);
      if (pcVar17 == (curl_slist *)0x0) {
        curl_slist_free_all(pTVar16->telnet_vars);
        pTVar16->telnet_vars = (curl_slist *)0x0;
        goto LAB_00156e68;
      }
      pTVar16->telnet_vars = pcVar17;
      pTVar16->us_preferred[0x27] = 1;
    }
    CVar13 = CURLE_OK;
    ppcVar26 = &(data->set).telnet_options;
    while ((CVar13 == CURLE_OK && (pcVar17 = *ppcVar26, pcVar17 != (curl_slist *)0x0))) {
      pcVar24 = pcVar17->data;
      pcVar18 = strchr(pcVar24,0x3d);
      if (pcVar18 == (char *)0x0) {
LAB_00156bba:
        Curl_failf(data,"Syntax error in telnet option: %s",pcVar24);
        CVar13 = CURLE_SETOPT_OPTION_SYNTAX;
      }
      else {
        str = pcVar18 + 1;
        _Var11 = str_is_nonascii(str);
        if (_Var11) {
LAB_00156ba8:
          CVar13 = CURLE_OK;
        }
        else {
          switch((long)pcVar18 - (long)pcVar24) {
          case 2:
            iVar12 = curl_strnequal(pcVar24,"WS",2);
            CVar13 = CURLE_UNKNOWN_OPTION;
            if (iVar12 != 0) {
              pfd[0].fd = 0;
              pfd[0].events = 0;
              pfd[0].revents = 0;
              nread = 0;
              buffer._0_8_ = str;
              iVar12 = Curl_str_number((char **)buffer,(curl_off_t *)pfd,0xffff);
              if (((iVar12 != 0) || (iVar12 = Curl_str_single((char **)buffer,'x'), iVar12 != 0)) ||
                 (iVar12 = Curl_str_number((char **)buffer,&nread,0xffff), iVar12 != 0)) {
                pcVar24 = pcVar17->data;
                goto LAB_00156bba;
              }
              pTVar16->subopt_wsx = (unsigned_short)pfd[0].fd;
              pTVar16->subopt_wsy = (unsigned_short)nread;
              pTVar16->us_preferred[0x1f] = 1;
              goto LAB_00156ba8;
            }
            break;
          default:
            Curl_failf(data,"Unknown telnet option %s",pcVar24);
            CVar13 = CURLE_UNKNOWN_OPTION;
            break;
          case 5:
            iVar12 = curl_strnequal(pcVar24,"TTYPE",5);
            CVar13 = CURLE_UNKNOWN_OPTION;
            if (iVar12 != 0) {
              pTVar16->subopt_ttype = str;
              pTVar16->us_preferred[0x18] = 1;
              goto LAB_00156ba8;
            }
            break;
          case 6:
            iVar12 = curl_strnequal(pcVar24,"BINARY",6);
            CVar13 = CURLE_UNKNOWN_OPTION;
            if (iVar12 != 0) {
              iVar12 = atoi(str);
              if (iVar12 != 1) {
                pTVar16->us_preferred[0] = 0;
                pTVar16->him_preferred[0] = 0;
              }
              goto LAB_00156ba8;
            }
            break;
          case 7:
            iVar12 = curl_strnequal(pcVar24,"NEW_ENV",7);
            CVar13 = CURLE_UNKNOWN_OPTION;
            if (iVar12 != 0) {
              pcVar19 = curl_slist_append(pTVar16->telnet_vars,str);
              CVar13 = CURLE_OUT_OF_MEMORY;
              if (pcVar19 != (curl_slist *)0x0) {
                pTVar16->telnet_vars = pcVar19;
                pTVar16->us_preferred[0x27] = 1;
                goto LAB_00156ba8;
              }
            }
            break;
          case 8:
            iVar12 = curl_strnequal(pcVar24,"XDISPLOC",8);
            CVar13 = CURLE_UNKNOWN_OPTION;
            if (iVar12 != 0) {
              pTVar16->subopt_xdisploc = str;
              pTVar16->us_preferred[0x23] = 1;
              goto LAB_00156ba8;
            }
          }
        }
      }
      ppcVar26 = &pcVar17->next;
    }
    if (CVar13 == CURLE_OK) {
      pfd[0].events = 1;
      pfd[0].fd = cVar3;
      uVar5 = *(ulong *)&(data->set).field_0x89c;
      CVar13 = CURLE_OK;
      bVar30 = true;
      if ((uVar5 & 0x10) == 0) {
        pfd[1].fd = fileno((FILE *)(data->state).in);
        pfd[1].events = 1;
        local_1060 = 1000;
        nfds = 2;
        if (pfd[1].fd < 0) {
          bVar30 = false;
          Curl_failf(data,"cannot read input");
          CVar13 = CURLE_RECV_ERROR;
        }
      }
      else {
        local_1060 = 100;
        nfds = 1;
      }
      local_1048 = 0;
      local_1050 = 0;
LAB_00156ea4:
      if (bVar30) {
        iVar12 = Curl_poll(pfd,nfds,local_1060);
        if (iVar12 == 0) {
          pfd[0] = (pollfd)((ulong)pfd[0] & 0xffffffffffff);
          pfd[1].revents = 0;
          goto LAB_00156f13;
        }
        if (iVar12 != -1) {
          if (((ulong)pfd[0] & 0x1000000000000) == 0) goto LAB_00156f13;
          CVar13 = Curl_xfer_recv(data,buffer,0x1000,&nread);
          if (CVar13 != CURLE_OK) {
            bVar30 = true;
            if (CVar13 == CURLE_AGAIN) goto LAB_0015700b;
            goto LAB_00156fed;
          }
          if (nread < 1) {
            bVar30 = false;
            CVar13 = CURLE_OK;
          }
          else {
            local_1050 = local_1050 + nread;
            CVar13 = Curl_pgrsSetDownloadCounter(data,local_1050);
            sVar10 = nread;
            if (CVar13 != CURLE_OK) goto LAB_00156fed;
            pTVar6 = (data->req).p.telnet;
            local_1090 = &pTVar6->subpointer;
            puVar1 = pTVar6->subbuffer;
            uVar25 = 0;
            uVar29 = 0xffffffffffffffff;
            while( true ) {
              uVar28 = (uint)uVar29;
              if (sVar10 == uVar25) break;
              uVar15 = uVar28;
              if (CURL_TS_SE < pTVar6->telrcv_state) goto LAB_001576f2;
              bVar2 = buffer[uVar25];
              switch(pTVar6->telrcv_state) {
              case CURL_TS_DATA:
                if (bVar2 == 0xd) {
                  pTVar6->telrcv_state = CURL_TS_CR;
                }
                else if (bVar2 == 0xff) {
                  pTVar6->telrcv_state = CURL_TS_IAC;
                  goto LAB_001572cd;
                }
LAB_001575dc:
                uVar9 = uVar25;
                if (-1 < (int)uVar28) {
                  uVar9 = uVar29;
                }
                uVar15 = (uint)uVar9;
                break;
              case CURL_TS_IAC:
switchD_001570e2_caseD_1:
                switch(bVar2) {
                case 0xfa:
                  pTVar6->subpointer = puVar1;
LAB_00157455:
                  pTVar6->telrcv_state = CURL_TS_SB;
                  break;
                case 0xfb:
                  pTVar6->telrcv_state = CURL_TS_WILL;
                  break;
                case 0xfc:
                  pTVar6->telrcv_state = CURL_TS_WONT;
                  break;
                case 0xfd:
                  pTVar6->telrcv_state = CURL_TS_DO;
                  break;
                case 0xfe:
                  pTVar6->telrcv_state = CURL_TS_DONT;
                  break;
                case 0xff:
                  pTVar6->telrcv_state = CURL_TS_DATA;
                  goto LAB_001575dc;
                default:
                  pTVar6->telrcv_state = CURL_TS_DATA;
                  printoption(data,"RCVD",0xff,(uint)bVar2);
                }
                break;
              case CURL_TS_WILL:
                printoption(data,"RCVD",0xfb,(uint)bVar2);
                pTVar6->please_negotiate = 1;
                pTVar23 = (data->req).p.telnet;
                iVar12 = pTVar23->him[bVar2];
                if (iVar12 == 3) {
                  iVar12 = pTVar23->himq[bVar2];
                  if (iVar12 != 1) goto LAB_00157539;
                  pTVar23->him[bVar2] = 1;
LAB_0015751a:
                  pTVar23->himq[bVar2] = 0;
                }
                else if (iVar12 == 2) {
                  if (pTVar23->himq[bVar2] == 1) {
                    pTVar23->him[bVar2] = 3;
                    pTVar23->himq[bVar2] = 0;
                    goto LAB_0015769c;
                  }
                  if (pTVar23->himq[bVar2] == 0) {
                    pTVar23->him[bVar2] = 1;
                  }
                }
                else if (iVar12 == 0) {
                  if (pTVar23->him_preferred[bVar2] == 1) {
                    pTVar23->him[bVar2] = 1;
                    goto LAB_001576bb;
                  }
LAB_0015769c:
                  iVar12 = 0xfe;
                  goto LAB_001576df;
                }
                goto LAB_001576e7;
              case CURL_TS_WONT:
                printoption(data,"RCVD",0xfc,(uint)bVar2);
                pTVar6->please_negotiate = 1;
                pTVar23 = (data->req).p.telnet;
                iVar12 = pTVar23->him[bVar2];
                if (iVar12 == 3) {
                  iVar12 = pTVar23->himq[bVar2];
                  if (iVar12 == 1) {
                    pTVar23->him[bVar2] = 2;
                    pTVar23->himq[bVar2] = 0;
LAB_001576bb:
                    iVar12 = 0xfd;
                    goto LAB_001576df;
                  }
                }
                else {
                  if (iVar12 != 2) {
                    if (iVar12 == 1) {
                      pTVar23->him[bVar2] = 0;
                      goto LAB_0015769c;
                    }
                    goto LAB_001576e7;
                  }
                  iVar12 = pTVar23->himq[bVar2];
                  if (iVar12 == 1) {
                    pTVar23->him[bVar2] = 0;
                    goto LAB_0015751a;
                  }
                }
LAB_00157539:
                if (iVar12 == 0) {
                  pTVar23->him[bVar2] = 0;
                }
                goto LAB_001576e7;
              case CURL_TS_DO:
                printoption(data,"RCVD",0xfd,(uint)bVar2);
                pTVar6->please_negotiate = 1;
                pTVar23 = (data->req).p.telnet;
                iVar12 = pTVar23->us[bVar2];
                if (iVar12 == 3) {
                  if (pTVar23->usq[bVar2] == 1) {
                    pTVar23->us[bVar2] = 1;
                    pTVar23->usq[bVar2] = 0;
                  }
                  else if (pTVar23->usq[bVar2] == 0) {
                    pTVar23->us[bVar2] = 0;
                  }
                }
                else if (iVar12 == 2) {
                  if (pTVar23->usq[bVar2] == 1) {
                    pTVar23->us[bVar2] = 3;
                    pTVar23->himq[bVar2] = 0;
LAB_00157651:
                    send_negotiation(data,0xfc,(uint)bVar2);
                  }
                  else if (pTVar23->usq[bVar2] == 0) {
                    pTVar23->us[bVar2] = 1;
                    goto LAB_00157487;
                  }
                }
                else if (iVar12 == 0) {
                  if (pTVar23->us_preferred[bVar2] == 1) {
                    pTVar23->us[bVar2] = 1;
                    send_negotiation(data,0xfb,(uint)bVar2);
LAB_00157487:
                    if (pTVar23->subnegotiation[bVar2] != 1) goto LAB_00157675;
                  }
                  else {
                    if (pTVar23->subnegotiation[bVar2] != 1) goto LAB_00157651;
                    pTVar23->us[bVar2] = 1;
                    send_negotiation(data,0xfb,(uint)bVar2);
                  }
                  sendsuboption(data,(uint)bVar2);
                }
LAB_00157675:
                pTVar6->telrcv_state = CURL_TS_DATA;
                break;
              case CURL_TS_DONT:
                printoption(data,"RCVD",0xfe,(uint)bVar2);
                pTVar6->please_negotiate = 1;
                pTVar23 = (data->req).p.telnet;
                iVar12 = pTVar23->us[bVar2];
                if (iVar12 == 3) {
                  iVar12 = pTVar23->usq[bVar2];
                  if (iVar12 == 1) {
                    pTVar23->us[bVar2] = 2;
                    pTVar23->usq[bVar2] = 0;
                    iVar12 = 0xfb;
LAB_001576df:
                    send_negotiation(data,iVar12,(uint)bVar2);
                  }
                  else {
LAB_00157581:
                    if (iVar12 == 0) {
                      pTVar23->us[bVar2] = 0;
                    }
                  }
                }
                else if (iVar12 == 2) {
                  iVar12 = pTVar23->usq[bVar2];
                  if (iVar12 != 1) goto LAB_00157581;
                  pTVar23->us[bVar2] = 0;
                  pTVar23->usq[bVar2] = 0;
                }
                else if (iVar12 == 1) {
                  pTVar23->us[bVar2] = 0;
                  iVar12 = 0xfc;
                  goto LAB_001576df;
                }
                goto LAB_001576e7;
              case CURL_TS_CR:
                pTVar6->telrcv_state = CURL_TS_DATA;
                if (bVar2 != 0) goto LAB_001575dc;
LAB_001572cd:
                uVar15 = 0xffffffff;
                if (-1 < (int)uVar28) {
                  CVar13 = Curl_client_write(data,1,buffer + (uVar29 & 0xffffffff),
                                             (long)(int)((int)uVar25 - uVar28));
                  uVar15 = 0xffffffff;
                  if (CVar13 != CURLE_OK) goto LAB_00157727;
                }
                break;
              case CURL_TS_SB:
                if (bVar2 == 0xff) {
                  pTVar6->telrcv_state = CURL_TS_SE;
                }
                else {
                  pbVar22 = *local_1090;
                  if (pbVar22 < local_1090) {
                    *local_1090 = pbVar22 + 1;
                    *pbVar22 = bVar2;
                  }
                }
                break;
              case CURL_TS_SE:
                pbVar22 = *local_1090;
                if (bVar2 != 0xf0) {
                  if (bVar2 != 0xff) {
                    if (pbVar22 < local_1090) {
                      *local_1090 = pbVar22 + 1;
                      *pbVar22 = 0xff;
                      pbVar22 = *local_1090;
                    }
                    if (pbVar22 < local_1090) {
                      *local_1090 = pbVar22 + 1;
                      *pbVar22 = bVar2;
                      pbVar22 = *local_1090;
                    }
                    pTVar6->subend = pbVar22 + -2;
                    pTVar6->subpointer = puVar1;
                    printoption(data,"In SUBOPTION processing, RCVD",0xff,(uint)bVar2);
                    suboption(data);
                    pTVar6->telrcv_state = CURL_TS_IAC;
                    goto switchD_001570e2_caseD_1;
                  }
                  if (pbVar22 < local_1090) {
                    *local_1090 = pbVar22 + 1;
                    *pbVar22 = 0xff;
                  }
                  goto LAB_00157455;
                }
                if (pbVar22 < local_1090) {
                  *local_1090 = pbVar22 + 1;
                  *pbVar22 = 0xff;
                  pbVar22 = *local_1090;
                }
                if (pbVar22 < local_1090) {
                  *local_1090 = pbVar22 + 1;
                  *pbVar22 = 0xf0;
                  pbVar22 = *local_1090;
                }
                pTVar6->subend = pbVar22 + -2;
                pTVar6->subpointer = puVar1;
                suboption(data);
LAB_001576e7:
                pTVar6->telrcv_state = CURL_TS_DATA;
              }
LAB_001576f2:
              uVar25 = uVar25 + 1;
              uVar29 = (ulong)uVar15;
            }
            if (((int)uVar28 < 0) ||
               (CVar13 = Curl_client_write(data,1,buffer + (uVar29 & 0xffffffff),
                                           (long)(int)((int)sVar10 - uVar28)), CVar13 == CURLE_OK))
            {
              CVar13 = CURLE_OK;
              if ((pTVar16->please_negotiate != 0) && (pTVar16->already_negotiated == 0)) {
                pTVar6 = (data->req).p.telnet;
                lVar27 = 0;
                do {
                  if (lVar27 != 1) {
                    if (lVar27 == 0x28) goto LAB_00157863;
                    if (pTVar6->us_preferred[lVar27] == 1) {
                      pTVar23 = (data->req).p.telnet;
                      iVar12 = pTVar23->us[lVar27];
                      if (iVar12 == 3) {
                        if (pTVar23->usq[lVar27] == 0) {
                          pTVar23->usq[lVar27] = 1;
                        }
                      }
                      else if (iVar12 == 2) {
                        if (pTVar23->usq[lVar27] == 1) {
                          pTVar23->usq[lVar27] = 0;
                        }
                      }
                      else if (iVar12 == 0) {
                        pTVar23->us[lVar27] = 2;
                        send_negotiation(data,0xfb,(int)lVar27);
                      }
                    }
                    if (pTVar6->him_preferred[lVar27] == 1) {
                      pTVar23 = (data->req).p.telnet;
                      iVar12 = pTVar23->him[lVar27];
                      if (iVar12 == 3) {
                        if (pTVar23->himq[lVar27] == 0) {
                          pTVar23->himq[lVar27] = 1;
                        }
                      }
                      else if (iVar12 == 2) {
                        if (pTVar23->himq[lVar27] == 1) {
                          pTVar23->himq[lVar27] = 0;
                        }
                      }
                      else if (iVar12 == 0) {
                        pTVar23->him[lVar27] = 2;
                        send_negotiation(data,0xfd,(int)lVar27);
                      }
                    }
                  }
                  lVar27 = lVar27 + 1;
                } while( true );
              }
              goto LAB_00156f13;
            }
LAB_00157727:
            bVar30 = false;
          }
          goto LAB_0015700b;
        }
      }
      goto LAB_00157882;
    }
    curl_slist_free_all(pTVar16->telnet_vars);
    pTVar16->telnet_vars = (curl_slist *)0x0;
  }
  return CVar13;
LAB_00157863:
  pTVar16->already_negotiated = 1;
LAB_00156f13:
  nread = 0;
  if ((uVar5 & 0x10) == 0) {
    if ((pfd[1].revents & 1U) != 0) {
      nread = read(pfd[1].fd,buffer,0x1000);
LAB_00156f96:
      if (0 < nread) {
        CVar14 = send_telnet_data(data,buffer,nread);
        CVar13 = CURLE_OK;
        if (CVar14 != CURLE_OK) {
          bVar30 = false;
          CVar13 = CVar14;
          goto LAB_0015700b;
        }
        local_1048 = local_1048 + nread;
        Curl_pgrsSetUploadCounter(data,local_1048);
        goto LAB_00157008;
      }
    }
    bVar30 = nread == 0;
  }
  else {
    sVar20 = (*(data->state).fread_func)(buffer,1,0x1000,(data->state).in);
    iVar12 = (int)sVar20;
    nread = (ssize_t)iVar12;
    if (iVar12 == 0x10000000) {
LAB_00156fed:
      bVar30 = false;
      goto LAB_0015700b;
    }
    if (iVar12 != 0x10000001) goto LAB_00156f96;
LAB_00157008:
    bVar30 = true;
  }
LAB_0015700b:
  if ((data->set).timeout != 0) {
    cVar31 = Curl_now();
    uVar7 = (pcVar4->created).tv_sec;
    uVar8 = (pcVar4->created).tv_usec;
    older.tv_usec = uVar8;
    older.tv_sec = uVar7;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar31._0_12_,0);
    newer.tv_usec = SUB124(cVar31._0_12_,8);
    older._12_4_ = 0;
    tVar21 = Curl_timediff(newer,older);
    if ((long)(ulong)(data->set).timeout <= tVar21) {
      bVar30 = false;
      Curl_failf(data,"Time-out");
      CVar13 = CURLE_OPERATION_TIMEDOUT;
    }
  }
  iVar12 = Curl_pgrsUpdate(data);
  if (iVar12 != 0) {
    CVar13 = CURLE_ABORTED_BY_CALLBACK;
LAB_00157882:
    Curl_xfer_setup_nop(data);
    return CVar13;
  }
  goto LAB_00156ea4;
}

Assistant:

static CURLcode telnet_do(struct Curl_easy *data, bool *done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD readfile_read;
  int err;
#else
  timediff_t interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct curltime now;
  bool keepon = TRUE;
  char buffer[4*1024];
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(data);
  if(result)
    return result;

  tn = data->req.p.telnet;

  result = check_telnet_options(data);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /* We want to wait for both stdin and the socket. Since
  ** the select() function in Winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = WSACreateEvent();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    return CURLE_FAILED_INIT;
  }

  /* Tell Winsock what events we want to listen to */
  if(WSAEventSelect(sockfd, event_handle, FD_READ|FD_CLOSE) == SOCKET_ERROR) {
    WSACloseEvent(event_handle);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Do not wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    const DWORD buf_size = (DWORD)sizeof(buffer);
    DWORD waitret = WaitForMultipleObjects(obj_count, objs,
                                           FALSE, wait_timeout);
    switch(waitret) {

    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          size_t n;
          /* read from user-supplied method */
          n = data->state.fread_func(buffer, 1, buf_size, data->state.in);
          if(n == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(n == CURL_READFUNC_PAUSE)
            break;

          if(n == 0)                        /* no bytes */
            break;

          /* fall through with number of bytes read */
          readfile_read = (DWORD)n;
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buffer, buf_size,
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(data, buffer, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buffer, buf_size,
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(data, buffer, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:
    {
      events.lNetworkEvents = 0;
      if(WSAEnumNetworkEvents(sockfd, event_handle, &events) == SOCKET_ERROR) {
        err = SOCKERRNO;
        if(err != SOCKEINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(data, (unsigned char *) buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
    }
    break;

    }

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!WSACloseEvent(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
    if(pfd[1].fd < 0) {
      failf(data, "cannot read input");
      result = CURLE_RECV_ERROR;
      keepon = FALSE;
    }
  }

  while(keepon) {
    DEBUGF(infof(data, "telnet_do, poll %d fds", poll_cnt));
    switch(Curl_poll(pfd, (unsigned int)poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      FALLTHROUGH();
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        if(result) {
          keepon = FALSE;
          /* In test 1452, macOS sees a ECONNRESET sometimes? Is this the
           * telnet test server not shutting down the socket in a clean way?
           * Seems to be timing related, happens more on slow debug build */
          if(data->state.os_errno == SOCKECONNRESET) {
            DEBUGF(infof(data, "telnet_do, unexpected ECONNRESET on recv"));
          }
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        result = Curl_pgrsSetDownloadCounter(data, total_dl);
        if(!result)
          result = telrcv(data, (unsigned char *)buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buffer, sizeof(buffer));
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buffer, 1, sizeof(buffer),
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(data, buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_xfer_setup_nop(data);

  return result;
}